

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::setLeaveBound4Col(SPxSolverBase<double> *this,int i,int n)

{
  double dVar1;
  Status *pSVar2;
  double *pdVar3;
  long in_RDI;
  int in_stack_ffffffffffffffac;
  SPxLPBase<double> *in_stack_ffffffffffffffb0;
  SPxLPBase<double> *this_00;
  
  SPxBasisBase<double>::desc((SPxBasisBase<double> *)(in_RDI + 0x1c8));
  pSVar2 = SPxBasisBase<double>::Desc::colStatus
                     ((Desc *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  switch(*pSVar2) {
  case P_FIXED:
    pdVar3 = (double *)infinity();
    dVar1 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    *pdVar3 = -dVar1;
    pdVar3 = (double *)infinity();
    dVar1 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    *pdVar3 = dVar1;
    break;
  default:
    pdVar3 = SPxLPBase<double>::upper(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    this_00 = (SPxLPBase<double> *)*pdVar3;
    pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)this_00,in_stack_ffffffffffffffac)
    ;
    *pdVar3 = (double)this_00;
    pdVar3 = SPxLPBase<double>::lower(this_00,in_stack_ffffffffffffffac);
    dVar1 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]((VectorBase<double> *)this_00,in_stack_ffffffffffffffac)
    ;
    *pdVar3 = dVar1;
    break;
  case P_ON_LOWER:
    pdVar3 = (double *)infinity();
    dVar1 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    *pdVar3 = -dVar1;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    *pdVar3 = 0.0;
    break;
  case P_ON_UPPER:
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    *pdVar3 = 0.0;
    pdVar3 = (double *)infinity();
    dVar1 = *pdVar3;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    *pdVar3 = dVar1;
    break;
  case P_FREE:
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    *pdVar3 = 0.0;
    pdVar3 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    *pdVar3 = 0.0;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setLeaveBound4Col(int i, int n)
{

   assert(this->baseId(i).isSPxColId());
   assert(this->number(SPxColId(this->baseId(i))) == n);

   switch(this->desc().colStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = 0;
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = 0;
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FIXED :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FREE :
      theLBbound[i] = theUBbound[i] = 0;
      break;

   default:
      theUBbound[i] = SPxLPBase<R>::upper(n);
      theLBbound[i] = SPxLPBase<R>::lower(n);
      break;
   }
}